

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

void * crn_compress(crn_comp_params *comp_params,crn_mipmap_params *mip_params,
                   crn_uint32 *compressed_size,crn_uint32 *pActual_quality_level,
                   float *pActual_bitrate)

{
  bool bVar1;
  uint uVar2;
  undefined4 *in_RCX;
  uint *in_RDX;
  crn_mipmap_params *in_RSI;
  crn_comp_params *in_RDI;
  undefined4 *in_R8;
  vector<unsigned_char> crn_file_data;
  float *in_stack_000003a8;
  uint32 *in_stack_000003b0;
  vector<unsigned_char> *in_stack_000003b8;
  crn_mipmap_params *in_stack_000003c0;
  crn_comp_params *in_stack_000003c8;
  vector<unsigned_char> *in_stack_ffffffffffffff90;
  vector<unsigned_char> local_40 [2];
  uint *local_20;
  crn_mipmap_params *local_18;
  vector<unsigned_char> *local_8;
  
  *in_RDX = 0;
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = crn_comp_params::check(in_RDI);
  if ((bVar1) && (bVar1 = crn_mipmap_params::check(local_18), bVar1)) {
    crnlib::vector<unsigned_char>::vector(local_40);
    bVar1 = crnlib::create_compressed_texture
                      (in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,
                       in_stack_000003a8);
    if (bVar1) {
      uVar2 = crnlib::vector<unsigned_char>::size(local_40);
      *local_20 = uVar2;
      in_stack_ffffffffffffff90 =
           (vector<unsigned_char> *)crnlib::vector<unsigned_char>::assume_ownership(local_40);
      local_8 = in_stack_ffffffffffffff90;
    }
    else {
      local_8 = (vector<unsigned_char> *)0x0;
    }
    crnlib::vector<unsigned_char>::~vector(in_stack_ffffffffffffff90);
  }
  else {
    local_8 = (vector<unsigned_char> *)0x0;
  }
  return local_8;
}

Assistant:

void* crn_compress(const crn_comp_params& comp_params, const crn_mipmap_params& mip_params, crn_uint32& compressed_size, crn_uint32* pActual_quality_level, float* pActual_bitrate) {
  compressed_size = 0;
  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  if ((!comp_params.check()) || (!mip_params.check()))
    return NULL;

  crnlib::vector<uint8> crn_file_data;
  if (!create_compressed_texture(comp_params, mip_params, crn_file_data, pActual_quality_level, pActual_bitrate))
    return NULL;

  compressed_size = crn_file_data.size();
  return crn_file_data.assume_ownership();
}